

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O1

int read_basic_type(coda_cursor *cursor,void *dst,long size_boundary)

{
  ushort *puVar1;
  long *plVar2;
  undefined1 uVar3;
  coda_dynamic_type_struct *pcVar4;
  coda_dynamic_type_struct *pcVar5;
  coda_type *pcVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uchar *v;
  int iVar11;
  coda_type *byte_offset;
  long lVar12;
  
  lVar9 = (long)cursor->n;
  pcVar4 = cursor->stack[lVar9 + -2].type;
  pcVar5 = cursor->stack[lVar9 + -1].type;
  byte_offset = pcVar5[1].definition;
  lVar12 = pcVar5->definition->bit_size >> 3;
  if ((pcVar4->backend == coda_backend_netcdf) &&
     (pcVar6 = pcVar4->definition, pcVar6->type_class == coda_array_class)) {
    plVar2 = &cursor->stack[lVar9 + -1].index;
    if (pcVar5[2].backend == coda_backend_ascii) {
      lVar9 = *plVar2 * lVar12;
    }
    else {
      lVar10 = *(long *)&pcVar6[1].type_class / (long)pcVar6[1].description;
      lVar7 = *plVar2;
      lVar9 = (lVar7 / lVar10) * *(long *)&cursor->product[1].format;
      byte_offset = (coda_type *)((long)&byte_offset->format + (lVar7 % lVar10) * lVar12);
    }
    byte_offset = (coda_type *)((long)&byte_offset->format + lVar9);
  }
  if ((-1 < size_boundary) && (size_boundary < lVar12)) {
    lVar12 = size_boundary;
  }
  iVar8 = read_bytes((coda_product *)cursor->product[1].filename,(int64_t)byte_offset,lVar12,dst);
  iVar11 = -1;
  if (iVar8 == 0) {
    iVar8 = 0;
    iVar11 = 0;
    if ((pcVar5->definition->type_class & ~coda_array_class) == coda_integer_class) {
      lVar12 = pcVar5->definition->bit_size;
      iVar11 = iVar8;
      switch(lVar12 << 0x3d | lVar12 - 8U >> 3) {
      case 0:
        break;
      case 1:
        *(ushort *)dst = *dst << 8 | *dst >> 8;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-cursor.c"
                      ,0x1a6,"int read_basic_type(const coda_cursor *, void *, long)");
      case 3:
        uVar3 = *(undefined1 *)((long)dst + 3);
        *(undefined1 *)((long)dst + 3) = *dst;
        *(undefined1 *)dst = uVar3;
        puVar1 = (ushort *)((long)dst + 1);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        break;
      case 7:
        swap8(dst);
      }
    }
  }
  return iVar11;
}

Assistant:

static int read_basic_type(const coda_cursor *cursor, void *dst, long size_boundary)
{
    coda_netcdf_basic_type *type;
    coda_netcdf_product *product;
    int64_t offset;
    int64_t byte_size;

    type = (coda_netcdf_basic_type *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;
    offset = type->offset;
    byte_size = type->definition->bit_size >> 3;

    if (cursor->stack[cursor->n - 2].type->backend == coda_backend_netcdf &&
        cursor->stack[cursor->n - 2].type->definition->type_class == coda_array_class)
    {
        if (type->record_var)
        {
            coda_netcdf_array *array = (coda_netcdf_array *)cursor->stack[cursor->n - 2].type;
            long num_sub_elements;
            long record_index;

            num_sub_elements = array->definition->num_elements / array->definition->dim[0];
            record_index = cursor->stack[cursor->n - 1].index / num_sub_elements;
            /* jump to record */
            offset += record_index * product->record_size;
            /* jump to sub element in record */
            offset += (cursor->stack[cursor->n - 1].index - record_index * num_sub_elements) * byte_size;
        }
        else
        {
            offset += cursor->stack[cursor->n - 1].index * byte_size;
        }
    }

    if (size_boundary >= 0 && byte_size > size_boundary)
    {
        if (read_bytes(product->raw_product, offset, size_boundary, dst) != 0)
        {
            return -1;
        }
    }
    else
    {
        if (read_bytes(product->raw_product, offset, byte_size, dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    if (type->definition->type_class == coda_integer_class || type->definition->type_class == coda_real_class)
    {
        switch (type->definition->bit_size)
        {
            case 8:
                /* no endianness conversion needed */
                break;
            case 16:
                swap2(dst);
                break;
            case 32:
                swap4(dst);
                break;
            case 64:
                swap8(dst);
                break;
            default:
                assert(0);
                exit(1);
        }
    }
#endif

    return 0;
}